

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg-messages.c
# Opt level: O1

void insert_msg(borg_read_messages *msgs,borg_read_message *msg,wchar_t spell_number)

{
  char *pcVar1;
  char *pcVar2;
  int iVar3;
  borg_read_message *pbVar4;
  int *piVar5;
  int iVar6;
  long lVar7;
  long lVar8;
  
  if (msgs->messages == (borg_read_message *)0x0) {
    msgs->allocated = 10;
    pbVar4 = (borg_read_message *)mem_alloc(0xf0);
    msgs->messages = pbVar4;
    piVar5 = (int *)mem_alloc((long)msgs->allocated << 2);
    msgs->index = piVar5;
  }
  if (msg == (borg_read_message *)0x0) {
    pbVar4 = msgs->messages;
    iVar3 = msgs->count;
    lVar7 = (long)iVar3;
    pbVar4[lVar7].message_p1 = (char *)0x0;
    pbVar4[lVar7].message_p2 = (char *)0x0;
    pbVar4[lVar7].message_p3 = (char *)0x0;
    msgs->count = iVar3 + 1;
    pbVar4 = (borg_read_message *)mem_realloc(pbVar4,lVar7 * 0x18 + 0x18);
    msgs->messages = pbVar4;
    piVar5 = (int *)mem_realloc(msgs->index,(long)msgs->count << 2);
    msgs->index = piVar5;
    msgs->allocated = msgs->count;
  }
  else {
    lVar7 = (long)msgs->count;
    if (0 < lVar7) {
      pbVar4 = msgs->messages;
      pcVar1 = msg->message_p1;
      lVar8 = 0;
      do {
        pcVar2 = *(char **)((long)&pbVar4->message_p1 + lVar8);
        if (pcVar2 == (char *)0x0) {
          if (pcVar1 == (char *)0x0) goto LAB_00239881;
        }
        else if ((pcVar1 != (char *)0x0) && (iVar3 = strcmp(pcVar2,pcVar1), iVar3 == 0)) {
LAB_00239881:
          pcVar2 = *(char **)((long)&pbVar4->message_p2 + lVar8);
          if (pcVar2 == (char *)0x0) {
            if (msg->message_p2 == (char *)0x0) goto LAB_002398a6;
          }
          else if ((msg->message_p2 != (char *)0x0) &&
                  (iVar3 = strcmp(pcVar2,msg->message_p2), iVar3 == 0)) {
LAB_002398a6:
            pcVar2 = *(char **)((long)&pbVar4->message_p3 + lVar8);
            if (pcVar2 == (char *)0x0) {
              if (msg->message_p3 == (char *)0x0) goto LAB_002399ad;
            }
            else if ((msg->message_p3 != (char *)0x0) &&
                    (iVar3 = strcmp(pcVar2,msg->message_p3), iVar3 == 0)) {
LAB_002399ad:
              string_free(msg->message_p1);
              string_free(msg->message_p2);
              string_free(msg->message_p3);
              return;
            }
          }
        }
        lVar8 = lVar8 + 0x18;
      } while (lVar7 * 0x18 != lVar8);
    }
    pbVar4 = msgs->messages;
    pbVar4[lVar7].message_p3 = msg->message_p3;
    pcVar1 = msg->message_p2;
    pbVar4 = pbVar4 + lVar7;
    pbVar4->message_p1 = msg->message_p1;
    pbVar4->message_p2 = pcVar1;
    msgs->index[msgs->count] = spell_number;
    iVar6 = msgs->count + 1;
    msgs->count = iVar6;
    iVar3 = msgs->allocated;
    if (iVar6 == iVar3) {
      msgs->allocated = iVar3 + 10;
      pbVar4 = (borg_read_message *)mem_realloc(msgs->messages,((long)iVar3 * 8 + 0x50) * 3);
      msgs->messages = pbVar4;
      piVar5 = (int *)mem_realloc(msgs->index,(long)msgs->allocated << 2);
      msgs->index = piVar5;
    }
  }
  return;
}

Assistant:

static void insert_msg(struct borg_read_messages *msgs,
    struct borg_read_message *msg, int spell_number)
{
    int  i;
    bool found_dup = false;

    /* this way we don't have to pre-create the array */
    if (msgs->messages == NULL) {
        msgs->allocated = 10;
        msgs->messages
            = mem_alloc(sizeof(struct borg_read_message) * msgs->allocated);
        msgs->index = mem_alloc(sizeof(int) * msgs->allocated);
    }

    if (msg == NULL) {
        msgs->messages[msgs->count].message_p1 = NULL;
        msgs->messages[msgs->count].message_p2 = NULL;
        msgs->messages[msgs->count].message_p3 = NULL;
        msgs->count++;
        /* shrink array down, we are done*/
        msgs->messages = mem_realloc(
            msgs->messages, sizeof(struct borg_read_message) * msgs->count);
        msgs->index     = mem_realloc(msgs->index, sizeof(int) * msgs->count);
        msgs->allocated = msgs->count;
        return;
    }

    for (i = 0; i < msgs->count; i++) {
        if (borg_read_message_equal(&msgs->messages[i], msg)) {
            found_dup = true;
            break;
        }
    }
    if (!found_dup) {
        memcpy(&(msgs->messages[msgs->count]), msg,
            sizeof(struct borg_read_message));
        msgs->index[msgs->count] = spell_number;
        msgs->count++;
        if (msgs->count == msgs->allocated) {
            msgs->allocated += 10;
            msgs->messages = mem_realloc(msgs->messages,
                sizeof(struct borg_read_message) * msgs->allocated);
            msgs->index
                = mem_realloc(msgs->index, sizeof(int) * msgs->allocated);
        }
    } else {
        string_free(msg->message_p1);
        string_free(msg->message_p2);
        string_free(msg->message_p3);
    }
}